

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cpp
# Opt level: O0

int __thiscall r_memory_map::_get_posix_access_flags(r_memory_map *this,int flags)

{
  uint local_18;
  int osFlags;
  int flags_local;
  r_memory_map *this_local;
  
  local_18 = 0;
  if ((flags & 2U) != 0) {
    local_18 = 0x20;
  }
  if ((flags & 4U) != 0) {
    local_18 = local_18 | 1;
  }
  if ((flags & 8U) != 0) {
    local_18 = local_18 | 2;
  }
  if ((flags & 0x10U) != 0) {
    local_18 = local_18 | 0x10;
  }
  return local_18;
}

Assistant:

int r_memory_map::_get_posix_access_flags(int flags) const
{
    int osFlags = 0;

    if(flags & MM_TYPE_FILE)
        osFlags |= MAP_FILE;
    if(flags & MM_TYPE_ANON)
    {
        osFlags |= MAP_ANONYMOUS;
    }
    if(flags & MM_SHARED)
        osFlags |= MAP_SHARED;
    if(flags & MM_PRIVATE)
        osFlags |= MAP_PRIVATE;
    if(flags & MM_FIXED)
        osFlags |= MAP_FIXED;

    return osFlags;
}